

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

void __thiscall
JsrtDebugManager::CallDebugEventCallbackForBreak
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext)

{
  ScriptContext *this_00;
  int iVar1;
  ThreadContext *pTVar2;
  DebuggingFlags *this_01;
  undefined1 local_38 [8];
  AutoSetDispatchHaltFlag autoSetDispatchHaltFlag;
  
  AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag
            ((AutoSetDispatchHaltFlag *)local_38,scriptContext,scriptContext->threadContext);
  CallDebugEventCallback(this,debugEvent,eventDataObject,scriptContext,true);
  pTVar2 = scriptContext->threadContext;
  this_00 = pTVar2->scriptContextList;
  if (this_00 != (ScriptContext *)0x0) {
    iVar1 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00);
    if ((char)iVar1 == '\0') {
      Js::ScriptContext::GetDebugContext(this_00);
    }
    pTVar2 = scriptContext->threadContext;
  }
  this_01 = Js::DebugManager::GetDebuggingFlags(pTVar2->debugManager);
  DebuggingFlags::SetForceInterpreter(this_01,false);
  AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag((AutoSetDispatchHaltFlag *)local_38);
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallbackForBreak(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext)
{
    AutoSetDispatchHaltFlag autoSetDispatchHaltFlag(scriptContext, scriptContext->GetThreadContext());

    this->CallDebugEventCallback(debugEvent, eventDataObject, scriptContext, true /*isBreak*/);

    for (Js::ScriptContext *tempScriptContext = scriptContext->GetThreadContext()->GetScriptContextList();
    tempScriptContext != nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->GetDebugContext()->GetProbeContainer()->AsyncDeactivate();
    }

    scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(false);
}